

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O0

Vec_Ptr_t * Gia_VtaAbsToFrames(Vec_Int_t *vAbs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  int local_34;
  int nFrames;
  int iStop;
  int iStart;
  int Entry;
  int k;
  int i;
  Vec_Int_t *vFrame;
  Vec_Ptr_t *vFrames;
  Vec_Int_t *vAbs_local;
  
  local_34 = -1;
  iVar1 = Vec_IntEntry(vAbs,0);
  iVar2 = Vec_IntEntry(vAbs,iVar1 + 1);
  iVar3 = Vec_IntSize(vAbs);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                  ,0x9a,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
  }
  p = Vec_PtrAlloc(iVar1);
  for (Entry = 0; Entry < iVar1; Entry = Entry + 1) {
    iStart = Vec_IntEntry(vAbs,Entry + 1);
    local_34 = Vec_IntEntry(vAbs,Entry + 2);
    p_00 = Vec_IntAlloc(local_34 - iStart);
    for (; iStart < local_34; iStart = iStart + 1) {
      iVar2 = Vec_IntEntry(vAbs,iStart);
      Vec_IntPush(p_00,iVar2);
    }
    Vec_PtrPush(p,p_00);
  }
  iVar1 = Vec_IntSize(vAbs);
  if (local_34 != iVar1) {
    __assert_fail("iStop == Vec_IntSize(vAbs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absVta.c"
                  ,0xa5,"Vec_Ptr_t *Gia_VtaAbsToFrames(Vec_Int_t *)");
  }
  return p;
}

Assistant:

Vec_Ptr_t * Gia_VtaAbsToFrames( Vec_Int_t * vAbs )
{
    Vec_Ptr_t * vFrames;
    Vec_Int_t * vFrame;
    int i, k, Entry, iStart, iStop = -1;
    int nFrames = Vec_IntEntry( vAbs, 0 );
    assert( Vec_IntEntry(vAbs, nFrames+1) == Vec_IntSize(vAbs) );
    vFrames = Vec_PtrAlloc( nFrames );
    for ( i = 0; i < nFrames; i++ )
    {
        iStart = Vec_IntEntry( vAbs, i+1 );
        iStop  = Vec_IntEntry( vAbs, i+2 );
        vFrame = Vec_IntAlloc( iStop - iStart );
        Vec_IntForEachEntryStartStop( vAbs, Entry, k, iStart, iStop )
            Vec_IntPush( vFrame, Entry );
        Vec_PtrPush( vFrames, vFrame );
    }
    assert( iStop == Vec_IntSize(vAbs) );
    return vFrames;
}